

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

void __thiscall toml::internal::Parser::addError(Parser *this,string *reason)

{
  ostream *poVar1;
  stringstream ss;
  long *local_1c0 [2];
  long local_1b0 [2];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  if ((this->errorReason_)._M_string_length == 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"Error: line ",0xc);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,(this->lexer_).lineNo_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(reason->_M_dataplus)._M_p,reason->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->errorReason_,(string *)local_1c0);
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0],local_1b0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  return;
}

Assistant:

inline const char* Value::typeToString(Value::Type type)
{
    switch (type) {
    case NULL_TYPE:   return "null";
    case BOOL_TYPE:   return "bool";
    case INT_TYPE:    return "int";
    case DOUBLE_TYPE: return "double";
    case STRING_TYPE: return "string";
    case TIME_TYPE:   return "time";
    case ARRAY_TYPE:  return "array";
    case TABLE_TYPE:  return "table";
    default:          return "unknown";
    }
}